

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_decrypt(uint16_t *plaintext,uint16_t *ciphertext,NTRUKeyPair *keypair)

{
  uint p_00;
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint16_t *out;
  ulong uStack_68;
  uint16_t diff_1;
  size_t i_2;
  ulong uStack_58;
  uint16_t diff;
  size_t i_1;
  uint mask;
  uint ok;
  size_t i;
  uint weight;
  uint16_t *tmp;
  uint w;
  uint q;
  uint p;
  NTRUKeyPair *keypair_local;
  uint16_t *ciphertext_local;
  uint16_t *plaintext_local;
  
  p_00 = keypair->p;
  uVar3 = keypair->q;
  uVar1 = keypair->w;
  out = (uint16_t *)safemalloc((ulong)p_00,2,0);
  ntru_ring_multiply(out,ciphertext,keypair->f3,p_00,uVar3);
  ntru_mod3(out,out,p_00,uVar3);
  ntru_normalise(out,out,p_00,3);
  ntru_ring_multiply(plaintext,out,keypair->ginv,p_00,3);
  ring_free(out,p_00);
  i._4_4_ = p_00;
  for (_mask = 0; _mask < p_00; _mask = _mask + 1) {
    uVar3 = iszero(plaintext[_mask]);
    i._4_4_ = i._4_4_ - uVar3;
  }
  uVar3 = iszero((ushort)i._4_4_ ^ (ushort)uVar1);
  uVar2 = (short)uVar3 - 1;
  for (uStack_58 = 0; uStack_58 < uVar1; uStack_58 = uStack_58 + 1) {
    plaintext[uStack_58] = plaintext[uStack_58] ^ (plaintext[uStack_58] ^ 1) & uVar2;
  }
  for (uStack_68 = (ulong)uVar1; uStack_68 < p_00; uStack_68 = uStack_68 + 1) {
    plaintext[uStack_68] = plaintext[uStack_68] ^ plaintext[uStack_68] & uVar2;
  }
  return;
}

Assistant:

void ntru_decrypt(uint16_t *plaintext, const uint16_t *ciphertext,
                  NTRUKeyPair *keypair)
{
    unsigned p = keypair->p, q = keypair->q, w = keypair->w;
    uint16_t *tmp = snewn(p, uint16_t);

    ntru_ring_multiply(tmp, ciphertext, keypair->f3, p, q);

    ntru_mod3(tmp, tmp, p, q);
    ntru_normalise(tmp, tmp, p, 3);

    ntru_ring_multiply(plaintext, tmp, keypair->ginv, p, 3);
    ring_free(tmp, p);

    /*
     * With luck, this should have recovered exactly the original
     * plaintext. But, as per the spec, we check whether it has
     * exactly w nonzero coefficients, and if not, then something has
     * gone wrong - and in that situation we time-safely substitute a
     * different output.
     *
     * (I don't know exactly why we do this, but I assume it's because
     * otherwise the mis-decoded output could be made to disgorge a
     * secret about the private key in some way.)
     */

    unsigned weight = p;
    for (size_t i = 0; i < p; i++)
        weight -= iszero(plaintext[i]);
    unsigned ok = iszero(weight ^ w);

    /*
     * The default failure return value consists of w 1s followed by
     * 0s.
     */
    unsigned mask = ok - 1;
    for (size_t i = 0; i < w; i++) {
        uint16_t diff = (1 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
    for (size_t i = w; i < p; i++) {
        uint16_t diff = (0 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
}